

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjEncodeYUV3(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
                uchar *dstBuf,int pad,int subsamp,int flags)

{
  int iVar1;
  char *pcVar2;
  int in_EDX;
  long in_RDI;
  int in_R8D;
  long in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  int ph1;
  int pw1;
  tjinstance *this;
  int retval;
  int strides [3];
  int ph0;
  int pw0;
  uchar *dstPlanes [3];
  int in_stack_000001c0;
  int in_stack_000001c4;
  int in_stack_000001c8;
  int in_stack_000001cc;
  uchar *in_stack_000001d0;
  tjhandle in_stack_000001d8;
  uchar **in_stack_000001f0;
  int *in_stack_000001f8;
  int in_stack_00000200;
  int in_stack_00000208;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  
  if (in_RDI == 0) {
    pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar2,200,"%s","tjEncodeYUV3(): Invalid handle");
  }
  else {
    *(undefined4 *)(in_RDI + 0x6d0) = 0;
    if ((((0 < in_EDX) && (0 < in_R8D)) && (in_stack_00000008 != 0)) &&
       (((-1 < (int)in_stack_00000010 && ((in_stack_00000010 & in_stack_00000010 - 1) == 0)) &&
        ((-1 < in_stack_00000018 && (in_stack_00000018 < 6)))))) {
      tjPlaneWidth(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      tjPlaneHeight(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      if (in_stack_00000018 != 3) {
        tjPlaneWidth(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        tjPlaneHeight(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
        ;
      }
      iVar1 = tjEncodeYUVPlanes(in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,
                                in_stack_000001c8,in_stack_000001c4,in_stack_000001c0,
                                in_stack_000001f0,in_stack_000001f8,in_stack_00000200,
                                in_stack_00000208);
      return iVar1;
    }
    snprintf((char *)(in_RDI + 0x608),200,"%s","tjEncodeYUV3(): Invalid argument");
    *(undefined4 *)(in_RDI + 0x6d0) = 1;
    pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar2,200,"%s","tjEncodeYUV3(): Invalid argument");
  }
  return -1;
}

Assistant:

DLLEXPORT int tjEncodeYUV3(tjhandle handle, const unsigned char *srcBuf,
                           int width, int pitch, int height, int pixelFormat,
                           unsigned char *dstBuf, int pad, int subsamp,
                           int flags)
{
  unsigned char *dstPlanes[3];
  int pw0, ph0, strides[3], retval = -1;
  tjinstance *this = (tjinstance *)handle;

  if (!this) THROWG("tjEncodeYUV3(): Invalid handle");
  this->isInstanceError = FALSE;

  if (width <= 0 || height <= 0 || dstBuf == NULL || pad < 0 ||
      !IS_POW2(pad) || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROW("tjEncodeYUV3(): Invalid argument");

  pw0 = tjPlaneWidth(0, width, subsamp);
  ph0 = tjPlaneHeight(0, height, subsamp);
  dstPlanes[0] = dstBuf;
  strides[0] = PAD(pw0, pad);
  if (subsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    dstPlanes[1] = dstPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, subsamp);
    int ph1 = tjPlaneHeight(1, height, subsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    dstPlanes[1] = dstPlanes[0] + strides[0] * ph0;
    dstPlanes[2] = dstPlanes[1] + strides[1] * ph1;
  }

  return tjEncodeYUVPlanes(handle, srcBuf, width, pitch, height, pixelFormat,
                           dstPlanes, strides, subsamp, flags);

bailout:
  return retval;
}